

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int sha1_reset(sha1_context *context)

{
  sha1_context *context_local;
  
  if (context != (sha1_context *)0x0) {
    context->length_low = 0;
    context->length_high = 0;
    context->message_block_index = 0;
    context->intermediate_hash[0] = 0x67452301;
    context->intermediate_hash[1] = 0xefcdab89;
    context->intermediate_hash[2] = 0x98badcfe;
    context->intermediate_hash[3] = 0x10325476;
    context->intermediate_hash[4] = 0xc3d2e1f0;
    context->computed = 0;
    context->corrupted = 0;
  }
  context_local._4_4_ = (uint)(context == (sha1_context *)0x0);
  return context_local._4_4_;
}

Assistant:

int sha1_reset(sha1_context *context)
{
	if (!context) {
		return SHA_NULL;
	}

	context->length_low = 0;
	context->length_high = 0;
	context->message_block_index = 0;

	context->intermediate_hash[0] = 0x67452301;
	context->intermediate_hash[1] = 0xEFCDAB89;
	context->intermediate_hash[2] = 0x98BADCFE;
	context->intermediate_hash[3] = 0x10325476;
	context->intermediate_hash[4] = 0xC3D2E1F0;

	context->computed = 0;
	context->corrupted = 0;

	return SHA_SUCCESS;
}